

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_multi(secp256k1_scratch *scratch,secp256k1_ecmult_multi_func ecmult_multi)

{
  size_t sVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  secp256k1_scalar *psVar10;
  long lVar11;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar12;
  secp256k1_strauss_point_state *psVar13;
  secp256k1_gej *psVar14;
  secp256k1_strauss_point_state *error_callback;
  secp256k1_ge *psVar15;
  uint64_t *puVar16;
  code *cb;
  secp256k1_scalar **cbdata;
  ulong uVar17;
  long lVar18;
  byte bVar19;
  ecmult_multi_data data;
  secp256k1_gej r;
  secp256k1_gej t1p;
  secp256k1_gej ptgj;
  secp256k1_scalar t1;
  secp256k1_scalar t0;
  secp256k1_gej expected;
  secp256k1_ge ptg;
  secp256k1_scalar tmp2;
  secp256k1_scalar tmp1;
  secp256k1_gej r2;
  secp256k1_fe aux [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  secp256k1_ge ptg_4;
  secp256k1_ge pt [32];
  secp256k1_scalar *local_1b90;
  secp256k1_ge *local_1b88;
  ulong local_1b80;
  ulong local_1b78;
  ulong local_1b70;
  ulong local_1b68;
  ulong local_1b60;
  ulong local_1b58;
  ulong local_1b50;
  secp256k1_gej local_1b48;
  secp256k1_gej local_1ac8;
  secp256k1_gej local_1a48;
  secp256k1_strauss_state local_19c0;
  secp256k1_scalar local_19a8;
  secp256k1_scalar local_1988;
  secp256k1_gej local_1968;
  secp256k1_gej local_18e8;
  secp256k1_scalar local_1868;
  secp256k1_scalar local_1848;
  undefined8 local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  undefined8 uStack_1810;
  undefined8 local_1808;
  undefined8 uStack_1800;
  undefined8 local_17f8;
  undefined8 uStack_17f0;
  undefined8 local_17e8;
  undefined8 uStack_17e0;
  undefined8 local_17d8;
  undefined8 uStack_17d0;
  secp256k1_scalar local_1468;
  secp256k1_scalar local_1448;
  secp256k1_gej local_1428;
  secp256k1_fe local_13a8 [8];
  secp256k1_strauss_point_state local_1268;
  secp256k1_gej local_e58 [5];
  secp256k1_ge local_b90;
  secp256k1_ge local_b38;
  secp256k1_ge local_ae0 [31];
  
  bVar19 = 0;
  local_1b90 = &local_1868;
  cbdata = &local_1b90;
  local_1b88 = &local_b38;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  cb = ecmult_multi_callback;
  psVar10 = (secp256k1_scalar *)0x0;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          (secp256k1_scalar *)0x0,ecmult_multi_callback,cbdata,0);
  if (iVar5 == 0) goto LAB_0016d463;
  if (0 < COUNT) {
    uVar8 = 0;
    do {
      local_1b80 = uVar8;
      testutil_random_scalar_order(&local_1868);
      testutil_random_scalar_order(&local_1848);
      testutil_random_ge_test((secp256k1_ge *)&local_18e8);
      local_1a48.infinity = (int)local_18e8.z.n[0];
      local_1a48.x.n[4] = local_18e8.x.n[4];
      local_1a48.x.n[2] = local_18e8.x.n[2];
      local_1a48.x.n[3] = local_18e8.x.n[3];
      local_1a48.x.n[0] = local_18e8.x.n[0];
      local_1a48.x.n[1] = local_18e8.x.n[1];
      local_1a48.y.n[4] = local_18e8.y.n[4];
      local_1a48.y.n[2] = local_18e8.y.n[2];
      local_1a48.y.n[3] = local_18e8.y.n[3];
      local_1a48.y.n[0] = local_18e8.y.n[0];
      local_1a48.y.n[1] = local_18e8.y.n[1];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      psVar14 = &local_18e8;
      psVar12 = &local_b38;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar12->x).n[0] = (psVar14->x).n[0];
        psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar19 * -0x10 + 8);
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar19 * -2 + 1) * 8);
      }
      psVar12 = &secp256k1_ge_const_g;
      psVar15 = local_ae0;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar15->x).n[0] = (psVar12->x).n[0];
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar19 * -2 + 1) * 8);
        psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar19 * -2 + 1) * 8);
      }
      psVar10 = &local_1868;
      local_1ac8.x.n[2] = (uint64_t)&local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,
                 &secp256k1_scalar_zero,psVar10);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b90;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,psVar10,
                              ecmult_multi_callback,&local_1b90,0);
      if (iVar5 == 0) goto LAB_0016d418;
      secp256k1_gej_neg((secp256k1_gej *)&local_1268,&local_1b48);
      psVar10 = (secp256k1_scalar *)0x0;
      psVar13 = &local_1268;
      error_callback = &local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_1268,(secp256k1_gej *)&local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_1268.wnaf_na_1[0x1e] == 0) goto LAB_0016d41d;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      local_1ac8.x.n[2] = (uint64_t)&local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,&local_1868,
                 &secp256k1_scalar_zero);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b90;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_callback,&local_1b90,1);
      if (iVar5 == 0) goto LAB_0016d422;
      secp256k1_gej_neg((secp256k1_gej *)&local_1268,&local_1b48);
      psVar10 = (secp256k1_scalar *)0x0;
      psVar13 = &local_1268;
      error_callback = &local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_1268,(secp256k1_gej *)&local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_1268.wnaf_na_1[0x1e] == 0) goto LAB_0016d427;
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_false_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b90;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_false_callback,&local_1b90,1);
      if (iVar5 != 0) goto LAB_0016d42c;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      local_1ac8.x.n[2] = (uint64_t)&local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,&local_1868,
                 &local_1848);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b90;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_callback,&local_1b90,2);
      if (iVar5 == 0) goto LAB_0016d431;
      secp256k1_gej_neg((secp256k1_gej *)&local_1268,&local_1b48);
      psVar10 = (secp256k1_scalar *)0x0;
      psVar13 = &local_1268;
      error_callback = &local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_1268,(secp256k1_gej *)&local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_1268.wnaf_na_1[0x1e] == 0) goto LAB_0016d436;
      local_1ac8.x.n[0] = (uint64_t)local_13a8;
      local_1ac8.x.n[1] = (uint64_t)local_e58;
      psVar10 = &local_1848;
      local_1ac8.x.n[2] = (uint64_t)&local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1ac8,&local_1428,1,&local_1a48,&local_1868,
                 psVar10);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      cb = ecmult_multi_callback;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      cbdata = &local_1b90;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,psVar10,
                              ecmult_multi_callback,&local_1b90,1);
      if (iVar5 == 0) goto LAB_0016d43b;
      secp256k1_gej_neg((secp256k1_gej *)&local_1268,&local_1b48);
      psVar10 = (secp256k1_scalar *)0x0;
      psVar13 = &local_1268;
      error_callback = &local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_1268,(secp256k1_gej *)&local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_1268.wnaf_na_1[0x1e] == 0) goto LAB_0016d440;
      uVar6 = (int)local_1b80 + 1;
      uVar8 = (ulong)uVar6;
    } while ((int)uVar6 < COUNT);
  }
  if (0 < COUNT) {
    uVar8 = 0;
    do {
      lVar9 = 0;
      local_1b80 = uVar8;
      do {
        lVar18 = 0x50;
        psVar10 = &local_1868;
        do {
          testutil_random_scalar_order(psVar10);
          *(undefined4 *)((long)local_b38.x.n + lVar18) = 1;
          *(undefined8 *)((long)local_b90.x.n + lVar18 + 8) = 0;
          *(undefined8 *)((long)local_b90.x.n + lVar18 + 0x10) = 0;
          *(undefined8 *)((long)local_b90.x.n + lVar18 + 0x18) = 0;
          *(undefined8 *)((long)local_b90.x.n + lVar18 + 0x20) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar18) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar18 + 8) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar18 + 0x10) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar18 + 0x18) = 0;
          *(undefined8 *)((long)local_b90.y.n + lVar18 + 0x20) = 0;
          *(undefined8 *)((long)(&local_b90.y + 1) + lVar18) = 0;
          lVar18 = lVar18 + 0x58;
          psVar10 = psVar10 + 1;
        } while (lVar18 != 0xb50);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b90;
        psVar13 = (secp256k1_strauss_point_state *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,
                                (&DAT_0018b730)[lVar9]);
        if (iVar5 == 0) goto LAB_0016d3f0;
        if (local_1b48.infinity == 0) goto LAB_0016d3f5;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar9 = 0;
      do {
        psVar12 = &local_b38;
        lVar18 = 0;
        do {
          testutil_random_ge_test((secp256k1_ge *)&local_1268);
          psVar13 = &local_1268;
          psVar15 = psVar12;
          for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar15->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar19 * -0x10 + 8);
            psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar19 * -2 + 1) * 8);
          }
          *(undefined8 *)((long)local_1868.d + lVar18 + 0x10) = 0;
          *(undefined8 *)((long)local_1868.d + lVar18 + 0x18) = 0;
          *(undefined8 *)((long)local_1868.d + lVar18) = 0;
          *(undefined8 *)((long)local_1868.d + lVar18 + 8) = 0;
          lVar18 = lVar18 + 0x20;
          psVar12 = psVar12 + 1;
        } while (lVar18 != 0x400);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b90;
        psVar13 = (secp256k1_strauss_point_state *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,
                                (&DAT_0018b730)[lVar9]);
        if (iVar5 == 0) goto LAB_0016d3fa;
        if (local_1b48.infinity == 0) goto LAB_0016d3ff;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar9 = 0;
      do {
        testutil_random_ge_test((secp256k1_ge *)&local_1268);
        lVar18 = 0x58;
        psVar10 = &local_1868;
        do {
          testutil_random_scalar_order(psVar10);
          secp256k1_scalar_negate(psVar10 + 1,psVar10);
          psVar13 = &local_1268;
          puVar16 = (uint64_t *)((long)local_b90.x.n + lVar18);
          for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar16 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar19 * -0x10 + 8);
            puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
          }
          psVar13 = &local_1268;
          puVar16 = (uint64_t *)((long)local_b38.x.n + lVar18);
          for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
            *puVar16 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar19 * -0x10 + 8);
            puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
          }
          lVar18 = lVar18 + 0xb0;
          psVar10 = psVar10 + 2;
        } while (lVar18 != 0xb58);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        sVar1 = (&DAT_0018b730)[lVar9];
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b90;
        psVar13 = (secp256k1_strauss_point_state *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,sVar1);
        if (iVar5 == 0) goto LAB_0016d404;
        if (local_1b48.infinity == 0) goto LAB_0016d409;
        testutil_random_scalar_order(&local_1868);
        lVar18 = 0x20;
        psVar12 = &local_b38;
        do {
          testutil_random_ge_test((secp256k1_ge *)&local_1268);
          uVar3 = local_1868.d[3];
          uVar2 = local_1868.d[1];
          *(uint64_t *)((long)local_18e8.z.n + lVar18 + 0x20) = local_1868.d[2];
          *(uint64_t *)((long)(&local_18e8.z + 1) + lVar18) = uVar3;
          *(uint64_t *)((long)local_18e8.z.n + lVar18 + 0x10) = local_1868.d[0];
          *(uint64_t *)((long)local_18e8.z.n + lVar18 + 0x18) = uVar2;
          *(uint64_t *)((long)local_1868.d + lVar18) = local_1868.d[0];
          *(uint64_t *)((long)local_1868.d + lVar18 + 8) = local_1868.d[1];
          *(uint64_t *)((long)local_1868.d + lVar18 + 0x10) = local_1868.d[2];
          *(uint64_t *)((long)local_1868.d + lVar18 + 0x18) = local_1868.d[3];
          psVar13 = &local_1268;
          psVar15 = psVar12;
          for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar15->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
            psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar19 * -0x10 + 8);
            psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar19 * -0x10 + 8);
          }
          secp256k1_ge_neg(psVar12 + 1,psVar12);
          lVar18 = lVar18 + 0x40;
          psVar12 = psVar12 + 2;
        } while (lVar18 != 0x420);
        error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
        psVar10 = &secp256k1_scalar_zero;
        cb = ecmult_multi_callback;
        cbdata = &local_1b90;
        psVar13 = (secp256k1_strauss_point_state *)scratch;
        iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                                &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,sVar1);
        if (iVar5 == 0) goto LAB_0016d40e;
        if (local_1b48.infinity == 0) goto LAB_0016d413;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      testutil_random_ge_test((secp256k1_ge *)&local_1268);
      local_1868.d[2] = 0;
      local_1868.d[3] = 0;
      local_1868.d[0] = 0;
      local_1868.d[1] = 0;
      psVar13 = &local_1268;
      psVar12 = &local_b38;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        (psVar12->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
        psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar19 * -0x10 + 8);
        psVar12 = (secp256k1_ge *)((long)psVar12 + ((ulong)bVar19 * -2 + 1) * 8);
      }
      lVar9 = 0x58;
      psVar10 = &local_1848;
      do {
        psVar13 = &local_1268;
        puVar16 = (uint64_t *)((long)local_b38.x.n + lVar9);
        for (lVar18 = 0xb; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar16 = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
          psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar19 * -0x10 + 8);
          puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
        }
        testutil_random_scalar_order(psVar10);
        secp256k1_scalar_add(&local_1868,&local_1868,psVar10);
        secp256k1_scalar_negate(psVar10,psVar10);
        lVar9 = lVar9 + 0x58;
        psVar10 = psVar10 + 1;
      } while (lVar9 != 0xb00);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1b90;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x20);
      if (iVar5 == 0) goto LAB_0016d459;
      if (local_1b48.infinity == 0) goto LAB_0016d45e;
      uVar6 = (int)local_1b80 + 1;
      uVar8 = (ulong)uVar6;
    } while ((int)uVar6 < COUNT);
  }
  if (0 < COUNT) {
    iVar5 = 0;
    do {
      local_1b48.infinity = 1;
      local_1b48.x.n[0] = 0;
      local_1b48.x.n[1] = 0;
      local_1b48.x.n[2] = 0;
      local_1b48.x.n[3] = 0;
      local_1b48.x.n[4] = 0;
      local_1b48.y.n[0] = 0;
      local_1b48.y.n[1] = 0;
      local_1b48.y.n[2] = 0;
      local_1b48.y.n[3] = 0;
      local_1b48.y.n[4] = 0;
      local_1b48.z.n[0] = 0;
      local_1b48.z.n[1] = 0;
      local_1b48.z.n[2] = 0;
      local_1b48.z.n[3] = 0;
      local_1b48.z.n[4] = 0;
      testutil_random_scalar_order(&local_1868);
      psVar12 = &local_b38;
      lVar9 = 0;
      do {
        uVar4 = local_1868.d[3];
        uVar3 = local_1868.d[2];
        uVar2 = local_1868.d[1];
        *(uint64_t *)((long)local_1868.d + lVar9) = local_1868.d[0];
        *(uint64_t *)((long)local_1868.d + lVar9 + 8) = uVar2;
        *(uint64_t *)((long)local_1868.d + lVar9 + 0x10) = uVar3;
        *(uint64_t *)((long)local_1868.d + lVar9 + 0x18) = uVar4;
        testutil_random_ge_test((secp256k1_ge *)&local_1268);
        psVar13 = &local_1268;
        psVar15 = psVar12;
        for (lVar18 = 0xb; lVar18 != 0; lVar18 = lVar18 + -1) {
          (psVar15->x).n[0] = ((secp256k1_fe *)psVar13->wnaf_na_1)->n[0];
          psVar13 = (secp256k1_strauss_point_state *)((long)psVar13 + (ulong)bVar19 * -0x10 + 8);
          psVar15 = (secp256k1_ge *)((long)psVar15 + (ulong)bVar19 * -0x10 + 8);
        }
        secp256k1_gej_add_ge_var(&local_1b48,&local_1b48,psVar12,(secp256k1_fe *)0x0);
        lVar9 = lVar9 + 0x20;
        psVar12 = psVar12 + 1;
      } while (lVar9 != 0x280);
      local_1a48.x.n[0] = (uint64_t)local_13a8;
      local_1a48.x.n[1] = (uint64_t)local_e58;
      local_1a48.x.n[2] = (uint64_t)&local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1a48,&local_1428,1,&local_1b48,&local_1868,
                 &secp256k1_scalar_zero);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1b90;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      iVar7 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
      if (iVar7 == 0) goto LAB_0016d445;
      secp256k1_gej_neg((secp256k1_gej *)&local_1268,&local_1b48);
      psVar10 = (secp256k1_scalar *)0x0;
      psVar13 = &local_1268;
      error_callback = &local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_1268,(secp256k1_gej *)&local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_1268.wnaf_na_1[0x1e] == 0) goto LAB_0016d44a;
      iVar5 = iVar5 + 1;
    } while (iVar5 < COUNT);
  }
  if (0 < COUNT) {
    iVar5 = 0;
    do {
      local_1ac8.x.n[2] = 0;
      local_1ac8.x.n[3] = 0;
      local_1ac8.x.n[0] = 0;
      local_1ac8.x.n[1] = 0;
      testutil_random_ge_test((secp256k1_ge *)&local_18e8);
      psVar10 = &local_1868;
      lVar9 = 0;
      do {
        testutil_random_scalar_order(psVar10);
        psVar14 = &local_18e8;
        puVar16 = (uint64_t *)((long)local_b38.x.n + lVar9);
        for (lVar18 = 0xb; lVar18 != 0; lVar18 = lVar18 + -1) {
          *puVar16 = (psVar14->x).n[0];
          psVar14 = (secp256k1_gej *)((long)psVar14 + (ulong)bVar19 * -0x10 + 8);
          puVar16 = puVar16 + (ulong)bVar19 * -2 + 1;
        }
        secp256k1_scalar_add
                  ((secp256k1_scalar *)&local_1ac8,(secp256k1_scalar *)&local_1ac8,psVar10);
        lVar9 = lVar9 + 0x58;
        psVar10 = psVar10 + 1;
      } while (lVar9 != 0x6e0);
      local_1a48.infinity = local_b38.infinity;
      local_1a48.x.n[4] = local_b38.x.n[4];
      local_1a48.x.n[2] = local_b38.x.n[2];
      local_1a48.x.n[3] = local_b38.x.n[3];
      local_1a48.x.n[0] = local_b38.x.n[0];
      local_1a48.x.n[1] = local_b38.x.n[1];
      local_1a48.y.n[4] = local_b38.y.n[4];
      local_1a48.y.n[2] = local_b38.y.n[2];
      local_1a48.y.n[3] = local_b38.y.n[3];
      local_1a48.y.n[0] = local_b38.y.n[0];
      local_1a48.y.n[1] = local_b38.y.n[1];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      local_1968.x.n[0] = (uint64_t)local_13a8;
      local_1968.x.n[1] = (uint64_t)local_e58;
      local_1968.x.n[2] = (uint64_t)&local_1268;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_1968,&local_1428,1,&local_1a48,
                 (secp256k1_scalar *)&local_1ac8,&secp256k1_scalar_zero);
      error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
      psVar10 = &secp256k1_scalar_zero;
      cb = ecmult_multi_callback;
      cbdata = &local_1b90;
      psVar13 = (secp256k1_strauss_point_state *)scratch;
      iVar7 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                              &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
      if (iVar7 == 0) goto LAB_0016d44f;
      secp256k1_gej_neg((secp256k1_gej *)&local_1268,&local_1b48);
      psVar10 = (secp256k1_scalar *)0x0;
      psVar13 = &local_1268;
      error_callback = &local_1268;
      secp256k1_gej_add_var
                ((secp256k1_gej *)&local_1268,(secp256k1_gej *)&local_1268,&local_1428,
                 (secp256k1_fe *)0x0);
      if (local_1268.wnaf_na_1[0x1e] == 0) goto LAB_0016d454;
      iVar5 = iVar5 + 1;
    } while (iVar5 < COUNT);
  }
  lVar9 = 0;
  psVar12 = &local_b38;
  do {
    testutil_random_scalar_order((secp256k1_scalar *)((long)local_1868.d + lVar9));
    testutil_random_ge_test(psVar12);
    psVar12 = psVar12 + 1;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0x280);
  local_1868.d[2] = 0;
  local_1868.d[3] = 0;
  local_1868.d[0] = 0;
  local_1868.d[1] = 0;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar10 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1b90;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,0x14);
  if (iVar5 == 0) goto LAB_0016d468;
  local_17d8 = 0;
  uStack_17d0 = 0;
  local_17e8 = 0;
  uStack_17e0 = 0;
  local_17f8 = 0;
  uStack_17f0 = 0;
  local_1808 = 0;
  uStack_1800 = 0;
  local_1818 = 0;
  uStack_1810 = 0;
  local_1828 = 0;
  uStack_1820 = 0;
  local_1848.d[2] = 0;
  local_1848.d[3] = 0;
  local_1848.d[0] = 0;
  local_1848.d[1] = 0;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar10 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1b90;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,6);
  if (iVar5 == 0) goto LAB_0016d46d;
  error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
  psVar10 = &secp256k1_scalar_zero;
  cb = ecmult_multi_callback;
  cbdata = &local_1b90;
  psVar13 = (secp256k1_strauss_point_state *)scratch;
  iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,&local_1b48,
                          &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,5);
  if (iVar5 != 0) {
    if (local_1b48.infinity != 0) {
      testutil_random_ge_test(&local_b90);
      local_1a48.infinity = local_b90.infinity;
      local_1a48.x.n[0] = local_b90.x.n[0];
      local_1a48.x.n[1] = local_b90.x.n[1];
      local_1a48.x.n[2] = local_b90.x.n[2];
      local_1a48.x.n[3] = local_b90.x.n[3];
      local_1a48.x.n[4] = local_b90.x.n[4];
      local_1a48.y.n[0] = local_b90.y.n[0];
      local_1a48.y.n[1] = local_b90.y.n[1];
      local_1a48.y.n[2] = local_b90.y.n[2];
      local_1a48.y.n[3] = local_b90.y.n[3];
      local_1a48.y.n[4] = local_b90.y.n[4];
      local_1a48.z.n[0] = 1;
      local_1a48.z.n[1] = 0;
      local_1a48.z.n[2] = 0;
      local_1a48.z.n[3] = 0;
      local_1a48.z.n[4] = 0;
      local_1b78 = 0;
      do {
        local_1b70 = local_1b78 + 1 >> 1;
        local_1b68 = (ulong)((uint)local_1b78 & 1);
        uVar8 = 0;
        local_1b78 = local_1b78 + 1;
        do {
          local_1988.d[3] = 0;
          local_1988.d[1] = 0;
          local_1988.d[2] = 0;
          local_1988.d[0] = local_1b70;
          secp256k1_scalar_cond_negate(&local_1988,(int)local_1b68);
          local_1b60 = uVar8 + 1;
          local_19a8.d[0] = local_1b60 >> 1;
          local_19a8.d[1] = 0;
          local_19a8.d[2] = 0;
          local_19a8.d[3] = 0;
          secp256k1_scalar_cond_negate(&local_19a8,(uint)uVar8 & 1);
          local_1ac8.x.n[0] = (uint64_t)local_13a8;
          local_1ac8.x.n[1] = (uint64_t)local_e58;
          local_1ac8.x.n[2] = (uint64_t)&local_1268;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1ac8,&local_18e8,1,&local_1a48,&local_1988,
                     &secp256k1_scalar_zero);
          local_1968.x.n[0] = (uint64_t)local_13a8;
          local_1968.x.n[1] = (uint64_t)local_e58;
          local_1968.x.n[2] = (uint64_t)&local_1268;
          secp256k1_ecmult_strauss_wnaf
                    ((secp256k1_strauss_state *)&local_1968,&local_1ac8,1,&local_1a48,&local_19a8,
                     &secp256k1_scalar_zero);
          local_1b58 = 0;
          do {
            local_1b50 = local_1b58 + 1 >> 1;
            local_1b80 = (ulong)((uint)local_1b58 & 1);
            uVar8 = 0;
            local_1b58 = local_1b58 + 1;
            do {
              secp256k1_ge_set_gej(&local_b38,&local_18e8);
              secp256k1_ge_set_gej(local_ae0,&local_1ac8);
              local_1868.d[0] = local_1b50;
              local_1868.d[3] = 0;
              local_1868.d[1] = 0;
              local_1868.d[2] = 0;
              secp256k1_scalar_cond_negate(&local_1868,(int)local_1b80);
              uVar17 = uVar8 + 1;
              local_1848.d[0] = uVar17 >> 1;
              local_1848.d[1] = 0;
              local_1848.d[2] = 0;
              local_1848.d[3] = 0;
              secp256k1_scalar_cond_negate(&local_1848,(uint)uVar8 & 1);
              secp256k1_scalar_mul(&local_1448,&local_1988,&local_1868);
              secp256k1_scalar_mul(&local_1468,&local_19a8,&local_1848);
              secp256k1_scalar_add(&local_1448,&local_1448,&local_1468);
              local_19c0.aux = local_13a8;
              local_19c0.pre_a = (secp256k1_ge *)local_e58;
              local_19c0.ps = &local_1268;
              secp256k1_ecmult_strauss_wnaf
                        (&local_19c0,&local_1968,1,&local_1a48,&local_1448,&secp256k1_scalar_zero);
              error_callback = (secp256k1_strauss_point_state *)&CTX->error_callback;
              psVar10 = &secp256k1_scalar_zero;
              cb = ecmult_multi_callback;
              cbdata = &local_1b90;
              psVar13 = (secp256k1_strauss_point_state *)scratch;
              iVar5 = (*ecmult_multi)((secp256k1_callback *)error_callback,scratch,local_e58,
                                      &secp256k1_scalar_zero,ecmult_multi_callback,cbdata,2);
              if (iVar5 == 0) {
                test_ecmult_multi_cold_3();
LAB_0016d3eb:
                test_ecmult_multi_cold_2();
                goto LAB_0016d3f0;
              }
              secp256k1_gej_neg((secp256k1_gej *)&local_1268,local_e58);
              psVar10 = (secp256k1_scalar *)0x0;
              psVar13 = &local_1268;
              error_callback = &local_1268;
              secp256k1_gej_add_var
                        ((secp256k1_gej *)&local_1268,(secp256k1_gej *)&local_1268,&local_1968,
                         (secp256k1_fe *)0x0);
              if (local_1268.wnaf_na_1[0x1e] == 0) goto LAB_0016d3eb;
              uVar8 = uVar17;
            } while (uVar17 != 8);
          } while (local_1b58 != 8);
          uVar8 = local_1b60;
        } while (local_1b60 != 8);
        if (local_1b78 == 8) {
          return;
        }
      } while( true );
    }
    goto LAB_0016d477;
  }
  goto LAB_0016d472;
LAB_0016d3f0:
  test_ecmult_multi_cold_21();
LAB_0016d3f5:
  test_ecmult_multi_cold_20();
LAB_0016d3fa:
  test_ecmult_multi_cold_19();
LAB_0016d3ff:
  test_ecmult_multi_cold_18();
LAB_0016d404:
  test_ecmult_multi_cold_17();
LAB_0016d409:
  test_ecmult_multi_cold_16();
LAB_0016d40e:
  test_ecmult_multi_cold_15();
LAB_0016d413:
  test_ecmult_multi_cold_14();
LAB_0016d418:
  test_ecmult_multi_cold_29();
LAB_0016d41d:
  test_ecmult_multi_cold_28();
LAB_0016d422:
  test_ecmult_multi_cold_27();
LAB_0016d427:
  test_ecmult_multi_cold_26();
LAB_0016d42c:
  test_ecmult_multi_cold_1();
LAB_0016d431:
  test_ecmult_multi_cold_25();
LAB_0016d436:
  test_ecmult_multi_cold_24();
LAB_0016d43b:
  test_ecmult_multi_cold_23();
LAB_0016d440:
  test_ecmult_multi_cold_22();
LAB_0016d445:
  test_ecmult_multi_cold_11();
LAB_0016d44a:
  test_ecmult_multi_cold_10();
LAB_0016d44f:
  test_ecmult_multi_cold_9();
LAB_0016d454:
  test_ecmult_multi_cold_8();
LAB_0016d459:
  test_ecmult_multi_cold_13();
LAB_0016d45e:
  test_ecmult_multi_cold_12();
LAB_0016d463:
  test_ecmult_multi_cold_30();
LAB_0016d468:
  test_ecmult_multi_cold_7();
LAB_0016d46d:
  test_ecmult_multi_cold_6();
LAB_0016d472:
  test_ecmult_multi_cold_5();
LAB_0016d477:
  test_ecmult_multi_cold_4();
  secp256k1_ecmult_pippenger_batch
            ((secp256k1_callback *)error_callback,(secp256k1_scratch *)psVar13,r_00,psVar10,cb,
             cbdata,(size_t)scratch,0);
  return;
}

Assistant:

static void test_ecmult_multi(secp256k1_scratch *scratch, secp256k1_ecmult_multi_func ecmult_multi) {
    int ncount;
    secp256k1_scalar sc[32];
    secp256k1_ge pt[32];
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;

    data.sc = sc;
    data.pt = pt;

    /* No points to multiply */
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, NULL, ecmult_multi_callback, &data, 0));

    /* Check 1- and 2-point multiplies against ecmult */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_scalar_order(&sc[0]);
        testutil_random_scalar_order(&sc[1]);

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[0] = ptg;
        pt[1] = secp256k1_ge_const_g;

        /* only G scalar */
        secp256k1_ecmult(&r2, &ptgj, &secp256k1_scalar_zero, &sc[0]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[0], ecmult_multi_callback, &data, 0));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 1-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* Try to multiply 1 point, but callback returns false */
        CHECK(!ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_false_callback, &data, 1));

        /* 2-point */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
        CHECK(secp256k1_gej_eq_var(&r, &r2));

        /* 2-point with G scalar */
        secp256k1_ecmult(&r2, &ptgj, &sc[0], &sc[1]);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &sc[1], ecmult_multi_callback, &data, 1));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check infinite outputs of various forms */
    for (ncount = 0; ncount < COUNT; ncount++) {
        secp256k1_ge ptg;
        size_t i, j;
        size_t sizes[] = { 2, 10, 32 };

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_scalar_order(&sc[i]);
                secp256k1_ge_set_infinity(&pt[i]);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            for (i = 0; i < 32; i++) {
                testutil_random_ge_test(&ptg);
                pt[i] = ptg;
                secp256k1_scalar_set_int(&sc[i], 0);
            }
            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        for (j = 0; j < 3; j++) {
            testutil_random_ge_test(&ptg);
            for (i = 0; i < 16; i++) {
                testutil_random_scalar_order(&sc[2*i]);
                secp256k1_scalar_negate(&sc[2*i + 1], &sc[2*i]);
                pt[2 * i] = ptg;
                pt[2 * i + 1] = ptg;
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));

            testutil_random_scalar_order(&sc[0]);
            for (i = 0; i < 16; i++) {
                testutil_random_ge_test(&ptg);

                sc[2*i] = sc[0];
                sc[2*i+1] = sc[0];
                pt[2 * i] = ptg;
                secp256k1_ge_neg(&pt[2*i+1], &pt[2*i]);
            }

            CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, sizes[j]));
            CHECK(secp256k1_gej_is_infinity(&r));
        }

        testutil_random_ge_test(&ptg);
        secp256k1_scalar_set_int(&sc[0], 0);
        pt[0] = ptg;
        for (i = 1; i < 32; i++) {
            pt[i] = ptg;

            testutil_random_scalar_order(&sc[i]);
            secp256k1_scalar_add(&sc[0], &sc[0], &sc[i]);
            secp256k1_scalar_negate(&sc[i], &sc[i]);
        }

        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 32));
        CHECK(secp256k1_gej_is_infinity(&r));
    }

    /* Check random points, constant scalar */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_gej_set_infinity(&r);

        testutil_random_scalar_order(&sc[0]);
        for (i = 0; i < 20; i++) {
            secp256k1_ge ptg;
            sc[i] = sc[0];
            testutil_random_ge_test(&ptg);
            pt[i] = ptg;
            secp256k1_gej_add_ge_var(&r, &r, &pt[i], NULL);
        }

        secp256k1_ecmult(&r2, &r, &sc[0], &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Check random scalars, constant point */
    for (ncount = 0; ncount < COUNT; ncount++) {
        size_t i;
        secp256k1_ge ptg;
        secp256k1_gej p0j;
        secp256k1_scalar rs;
        secp256k1_scalar_set_int(&rs, 0);

        testutil_random_ge_test(&ptg);
        for (i = 0; i < 20; i++) {
            testutil_random_scalar_order(&sc[i]);
            pt[i] = ptg;
            secp256k1_scalar_add(&rs, &rs, &sc[i]);
        }

        secp256k1_gej_set_ge(&p0j, &pt[0]);
        secp256k1_ecmult(&r2, &p0j, &rs, &secp256k1_scalar_zero);
        CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
        CHECK(secp256k1_gej_eq_var(&r, &r2));
    }

    /* Sanity check that zero scalars don't cause problems */
    for (ncount = 0; ncount < 20; ncount++) {
        testutil_random_scalar_order(&sc[ncount]);
        testutil_random_ge_test(&pt[ncount]);
    }

    secp256k1_scalar_set_int(&sc[0], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 20));
    secp256k1_scalar_set_int(&sc[1], 0);
    secp256k1_scalar_set_int(&sc[2], 0);
    secp256k1_scalar_set_int(&sc[3], 0);
    secp256k1_scalar_set_int(&sc[4], 0);
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 6));
    CHECK(ecmult_multi(&CTX->error_callback, scratch, &r, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 5));
    CHECK(secp256k1_gej_is_infinity(&r));

    /* Run through s0*(t0*P) + s1*(t1*P) exhaustively for many small values of s0, s1, t0, t1 */
    {
        const size_t TOP = 8;
        size_t s0i, s1i;
        size_t t0i, t1i;
        secp256k1_ge ptg;
        secp256k1_gej ptgj;

        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);

        for(t0i = 0; t0i < TOP; t0i++) {
            for(t1i = 0; t1i < TOP; t1i++) {
                secp256k1_gej t0p, t1p;
                secp256k1_scalar t0, t1;

                secp256k1_scalar_set_int(&t0, (t0i + 1) / 2);
                secp256k1_scalar_cond_negate(&t0, t0i & 1);
                secp256k1_scalar_set_int(&t1, (t1i + 1) / 2);
                secp256k1_scalar_cond_negate(&t1, t1i & 1);

                secp256k1_ecmult(&t0p, &ptgj, &t0, &secp256k1_scalar_zero);
                secp256k1_ecmult(&t1p, &ptgj, &t1, &secp256k1_scalar_zero);

                for(s0i = 0; s0i < TOP; s0i++) {
                    for(s1i = 0; s1i < TOP; s1i++) {
                        secp256k1_scalar tmp1, tmp2;
                        secp256k1_gej expected, actual;

                        secp256k1_ge_set_gej(&pt[0], &t0p);
                        secp256k1_ge_set_gej(&pt[1], &t1p);

                        secp256k1_scalar_set_int(&sc[0], (s0i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[0], s0i & 1);
                        secp256k1_scalar_set_int(&sc[1], (s1i + 1) / 2);
                        secp256k1_scalar_cond_negate(&sc[1], s1i & 1);

                        secp256k1_scalar_mul(&tmp1, &t0, &sc[0]);
                        secp256k1_scalar_mul(&tmp2, &t1, &sc[1]);
                        secp256k1_scalar_add(&tmp1, &tmp1, &tmp2);

                        secp256k1_ecmult(&expected, &ptgj, &tmp1, &secp256k1_scalar_zero);
                        CHECK(ecmult_multi(&CTX->error_callback, scratch, &actual, &secp256k1_scalar_zero, ecmult_multi_callback, &data, 2));
                        CHECK(secp256k1_gej_eq_var(&actual, &expected));
                    }
                }
            }
        }
    }
}